

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O3

void Abc_NtkStrashPerform(Abc_Ntk_t *pNtkOld,Abc_Ntk_t *pNtkNew,int fAllNodes,int fRecord)

{
  Abc_Obj_t *pNodeOld;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pAVar1;
  uint fRecord_00;
  long extraout_RDX;
  long extraout_RDX_00;
  long lVar2;
  long lVar3;
  
  if (pNtkOld->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtkOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x1a2,"void Abc_NtkStrashPerform(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtkNew->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtkNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x1a3,"void Abc_NtkStrashPerform(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  __ptr = Abc_NtkDfsIter(pNtkOld,fAllNodes);
  if (0 < __ptr->nSize) {
    lVar3 = 0;
    lVar2 = extraout_RDX;
    do {
      fRecord_00 = (uint)lVar2;
      pNodeOld = (Abc_Obj_t *)__ptr->pArray[lVar3];
      if (pNodeOld->pNtk->ntkFunc == ABC_FUNC_MAP) {
        fRecord_00 = *(uint *)&pNodeOld->field_0x14 & 0xf;
        if (((fRecord_00 != 7) || ((pNodeOld->vFanins).nSize != 1)) ||
           ((pNodeOld->field_5).pData != (void *)0x0)) goto LAB_00308f14;
        lVar2 = (long)*(pNodeOld->vFanins).pArray;
        pAVar1 = (Abc_Obj_t *)
                 ((ulong)(*(uint *)&pNodeOld->field_0x14 >> 10 & 1) ^
                 *(ulong *)((long)pNodeOld->pNtk->vObjs->pArray[lVar2] + 0x40));
      }
      else {
LAB_00308f14:
        pAVar1 = Abc_NodeStrash(pNtkNew,pNodeOld,fRecord_00);
        lVar2 = extraout_RDX_00;
      }
      (pNodeOld->field_6).pCopy = pAVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkStrashPerform( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew, int fAllNodes, int fRecord )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNodeOld;
    int i; //, clk = Abc_Clock();
    assert( Abc_NtkIsLogic(pNtkOld) );
    assert( Abc_NtkIsStrash(pNtkNew) );
//    vNodes = Abc_NtkDfs( pNtkOld, fAllNodes );
    vNodes = Abc_NtkDfsIter( pNtkOld, fAllNodes );
//printf( "Nodes = %d. ", Vec_PtrSize(vNodes) );
//ABC_PRT( "Time", Abc_Clock() - clk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNodeOld, i )
    {
        if ( Abc_ObjIsBarBuf(pNodeOld) )
            pNodeOld->pCopy = Abc_ObjChild0Copy(pNodeOld);
        else
            pNodeOld->pCopy = Abc_NodeStrash( pNtkNew, pNodeOld, fRecord );
    }
    Vec_PtrFree( vNodes );
}